

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void prvTidyCheckAttributes(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  AttVal *attval;
  
  attval = node->attributes;
  while (attval != (AttVal *)0x0) {
    pAVar1 = attval->next;
    prvTidyCheckAttribute(doc,node,attval);
    attval = pAVar1;
  }
  return;
}

Assistant:

void TY_(CheckAttributes)( TidyDocImpl* doc, Node *node )
{
    AttVal *next, *attval = node->attributes;
    while (attval)
    {
        next = attval->next;
        TY_(CheckAttribute)( doc, node, attval );
        attval = next;
    }
}